

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O2

bool __thiscall FIX::Message::isAdmin(Message *this)

{
  bool bVar1;
  MsgType msgType;
  FieldBase local_70;
  
  MsgType::MsgType((MsgType *)&local_70);
  bVar1 = FieldMap::getFieldIfSet((FieldMap *)(this + 0x70),&local_70);
  if (bVar1) {
    bVar1 = isAdminMsgType((MsgType *)&local_70);
  }
  else {
    bVar1 = false;
  }
  FieldBase::~FieldBase(&local_70);
  return bVar1;
}

Assistant:

bool isAdmin() const
  { 
    MsgType msgType;
    if( m_header.getFieldIfSet( msgType ) )
      return isAdminMsgType( msgType );
    return false;
  }